

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O2

void __thiscall ConnectFourState::do_move(ConnectFourState *this,Move move)

{
  long lVar1;
  ulong uVar2;
  int line;
  uint uVar3;
  ulong uVar4;
  pointer pvVar5;
  char *expr;
  
  if ((move < 0) || (uVar2 = (ulong)(uint)move, this->num_cols <= move)) {
    expr = "0 <= move && move < num_cols";
    line = 0x1e;
  }
  else {
    if (*(char *)(*(long *)&(((this->board).
                              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                            super__Vector_impl_data + uVar2) == '.') {
      check_invariant(this);
      uVar4 = (ulong)this->num_rows;
      pvVar5 = (this->board).
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar4;
      do {
        pvVar5 = pvVar5 + -1;
        lVar1 = *(long *)&(pvVar5->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data;
        uVar3 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar3;
      } while (*(char *)(lVar1 + uVar2) != '.');
      *(char *)(lVar1 + uVar2) = ".XO"[this->player_to_move];
      this->last_col = move;
      this->last_row = uVar3;
      this->player_to_move = 3 - this->player_to_move;
      return;
    }
    expr = "board[0][move] == player_markers[0]";
    line = 0x1f;
  }
  MCTS::assertion_failed
            (expr,
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/connect_four.h"
             ,line);
}

Assistant:

void do_move(Move move)
	{
		attest(0 <= move && move < num_cols);
		attest(board[0][move] == player_markers[0]);
		check_invariant();

		int row = num_rows - 1;
		while (board[row][move] != player_markers[0]) row--;
		board[row][move] = player_markers[player_to_move];
		last_col = move;
		last_row = row;

		player_to_move = 3 - player_to_move;
	}